

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

QRectF * __thiscall
QWidgetTextControl::selectionRect
          (QRectF *__return_storage_ptr__,QWidgetTextControl *this,QTextCursor *cursor)

{
  QWidgetTextControlPrivate *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 *puVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined8 uVar11;
  long *plVar12;
  qreal extraout_RDX;
  qreal extraout_RDX_00;
  ConstIterator it;
  undefined8 *puVar13;
  int i;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined8 *puVar16;
  long in_FS_OFFSET;
  double dVar17;
  QRectF r;
  QRectF local_f8;
  QRectF local_d8;
  undefined1 local_b8 [32];
  QArrayData *local_98;
  undefined8 *puStack_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
  iVar7 = QTextCursor::selectionStart();
  QWidgetTextControlPrivate::rectForPosition(__return_storage_ptr__,this_00,iVar7);
  cVar6 = QTextCursor::hasComplexSelection();
  if ((cVar6 != '\0') && (lVar10 = QTextCursor::currentTable(), lVar10 != 0)) {
    uVar11 = QTextCursor::currentTable();
    plVar12 = (long *)QTextDocument::documentLayout();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*plVar12 + 0x80))(__return_storage_ptr__,plVar12,uVar11);
      return __return_storage_ptr__;
    }
    goto LAB_004bf246;
  }
  cVar6 = QTextCursor::hasSelection();
  if (cVar6 != '\0') {
    QTextCursor::selectionStart();
    QTextCursor::selectionEnd();
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_68);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_78);
    if (local_68 == local_78) {
      if (((int)puStack_60 != (int)puStack_70) || (cVar6 = QTextBlock::isValid(), cVar6 == '\0'))
      goto LAB_004bef65;
      QTextBlock::layout();
      iVar7 = QTextLayout::lineCount();
      if (iVar7 == 0) goto LAB_004bef65;
      iVar7 = QTextBlock::layout();
      QTextBlock::position();
      iVar8 = QTextLayout::lineForTextPosition(iVar7);
      iVar7 = QTextBlock::layout();
      QTextBlock::position();
      iVar9 = QTextLayout::lineForTextPosition(iVar7);
      iVar7 = iVar9;
      if (iVar8 < iVar9) {
        iVar7 = iVar8;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      iVar8 = QTextBlock::layout();
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      do {
        local_d8.xp._0_4_ = QTextLayout::lineAt(iVar8);
        local_d8.yp = extraout_RDX;
        QTextLine::rect();
        QRectF::operator|(&local_58,__return_storage_ptr__);
        __return_storage_ptr__->w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
        __return_storage_ptr__->h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
        __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
        __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
        local_d8.xp._0_4_ = QTextLayout::lineAt(iVar8);
        local_d8.yp = extraout_RDX_00;
        QTextLine::naturalTextRect();
        QRectF::operator|(&local_58,__return_storage_ptr__);
        *(undefined4 *)&__return_storage_ptr__->w = local_58.w._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = local_58.w._4_4_;
        *(undefined4 *)&__return_storage_ptr__->h = local_58.h._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = local_58.h._4_4_;
        __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
        __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
        iVar7 = iVar7 + 1;
      } while (iVar9 + 1 != iVar7);
      (**(code **)(*(long *)this + 0x80))(&local_58,this,&local_68);
      dVar3 = __return_storage_ptr__->xp + (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      dVar17 = __return_storage_ptr__->yp + (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
      auVar1._8_4_ = SUB84(dVar17,0);
      auVar1._0_8_ = dVar3;
      auVar1._12_4_ = (int)((ulong)dVar17 >> 0x20);
      __return_storage_ptr__->xp = dVar3;
      __return_storage_ptr__->yp = (qreal)auVar1._8_8_;
      dVar17 = __return_storage_ptr__->w;
    }
    else {
LAB_004bef65:
      local_d8.w._0_4_ = 0xffffffff;
      local_d8.w._4_4_ = 0xffffffff;
      local_d8.h._0_4_ = 0xffffffff;
      local_d8.h._4_4_ = 0xffffffff;
      local_d8.xp._0_4_ = 0xffffffff;
      local_d8.xp._4_4_ = 0xffffffff;
      local_d8.yp = -NAN;
      iVar7 = QTextCursor::selectionEnd();
      QWidgetTextControlPrivate::rectForPosition(&local_d8,this_00,iVar7);
      QRectF::operator|(&local_58,__return_storage_ptr__);
      __return_storage_ptr__->w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
      __return_storage_ptr__->h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
      __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
      local_f8.w = 0.0;
      local_f8.h = 0.0;
      local_f8.xp = 0.0;
      local_f8.yp = 0.0;
      QTextCursor::currentFrame();
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::childFrames();
      puVar14 = local_88;
      puVar13 = puStack_90;
      iVar7 = QTextCursor::selectionStart();
      puVar16 = puStack_90;
      puVar15 = local_88;
      while (puVar5 = puVar14, puStack_90 = puVar16, local_88 = puVar15, 0 < (long)puVar5) {
        puVar14 = (undefined1 *)((ulong)puVar5 >> 1);
        iVar9 = QTextFrame::firstPosition();
        puVar16 = puStack_90;
        puVar15 = local_88;
        if (iVar9 < iVar7) {
          puVar13 = puVar13 + (long)(puVar14 + 1);
          puVar14 = puVar5 + ~(ulong)puVar14;
        }
      }
      iVar7 = QTextCursor::selectionEnd();
      while (puVar14 = puVar15, 0 < (long)puVar14) {
        puVar15 = (undefined1 *)((ulong)puVar14 >> 1);
        iVar9 = QTextFrame::firstPosition();
        if (iVar9 <= iVar7) {
          puVar16 = puVar16 + (long)(puVar15 + 1);
          puVar15 = puVar14 + ~(ulong)puVar15;
        }
      }
      if (puVar13 != puVar16) {
        do {
          QTextFrame::frameFormat((QTextFrame *)&local_58);
          iVar7 = QTextFormat::intProperty((int)&local_58);
          QTextFormat::~QTextFormat((QTextFormat *)&local_58);
          if (iVar7 != 0) {
            QTextObject::document();
            plVar12 = (long *)QTextDocument::documentLayout();
            (**(code **)(*plVar12 + 0x80))(local_b8,plVar12,*puVar13);
            QRectF::operator|(&local_58,&local_f8);
            local_f8.xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
            local_f8.yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
            local_f8.w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
            local_f8.h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
          }
          puVar13 = puVar13 + 1;
        } while (puVar13 != puVar16);
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,8,0x10);
        }
      }
      QRectF::operator|(&local_58,__return_storage_ptr__);
      __return_storage_ptr__->w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
      __return_storage_ptr__->h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
      __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
      local_58.w._0_4_ = 0xffffffff;
      local_58.w._4_4_ = 0xffffffff;
      local_58.h._0_4_ = 0xffffffff;
      local_58.h._4_4_ = 0xffffffff;
      local_58.xp._0_4_ = 0xffffffff;
      local_58.xp._4_4_ = 0xffffffff;
      local_58.yp._0_4_ = 0xffffffff;
      local_58.yp._4_4_ = 0xffffffff;
      plVar12 = (long *)QTextDocument::documentLayout();
      uVar11 = QTextCursor::currentFrame();
      (**(code **)(*plVar12 + 0x80))(&local_58,plVar12,uVar11);
      dVar3 = ((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) - __return_storage_ptr__->xp) +
              __return_storage_ptr__->xp;
      __return_storage_ptr__->xp = dVar3;
      dVar17 = ((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
               (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) - dVar3;
      __return_storage_ptr__->w = dVar17;
    }
    if ((0.0 < dVar17) && (0.0 < __return_storage_ptr__->h)) {
      dVar4 = __return_storage_ptr__->yp + -1.0;
      auVar2._8_4_ = SUB84(dVar4,0);
      auVar2._0_8_ = dVar3 + -1.0;
      auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
      __return_storage_ptr__->xp = dVar3 + -1.0;
      __return_storage_ptr__->yp = (qreal)auVar2._8_8_;
      __return_storage_ptr__->w = dVar17 + 2.0;
      __return_storage_ptr__->h = __return_storage_ptr__->h + 2.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004bf246:
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetTextControl::selectionRect(const QTextCursor &cursor) const
{
    Q_D(const QWidgetTextControl);

    QRectF r = d->rectForPosition(cursor.selectionStart());

    if (cursor.hasComplexSelection() && cursor.currentTable()) {
        QTextTable *table = cursor.currentTable();

        r = d->doc->documentLayout()->frameBoundingRect(table);
        /*
        int firstRow, numRows, firstColumn, numColumns;
        cursor.selectedTableCells(&firstRow, &numRows, &firstColumn, &numColumns);

        const QTextTableCell firstCell = table->cellAt(firstRow, firstColumn);
        const QTextTableCell lastCell = table->cellAt(firstRow + numRows - 1, firstColumn + numColumns - 1);

        const QAbstractTextDocumentLayout * const layout = doc->documentLayout();

        QRectF tableSelRect = layout->blockBoundingRect(firstCell.firstCursorPosition().block());

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow, col);
            const qreal y = layout->blockBoundingRect(cell.firstCursorPosition().block()).top();

            tableSelRect.setTop(qMin(tableSelRect.top(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn);
            const qreal x = layout->blockBoundingRect(cell.firstCursorPosition().block()).left();

            tableSelRect.setLeft(qMin(tableSelRect.left(), x));
        }

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow + numRows - 1, col);
            const qreal y = layout->blockBoundingRect(cell.lastCursorPosition().block()).bottom();

            tableSelRect.setBottom(qMax(tableSelRect.bottom(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn + numColumns - 1);
            const qreal x = layout->blockBoundingRect(cell.lastCursorPosition().block()).right();

            tableSelRect.setRight(qMax(tableSelRect.right(), x));
        }

        r = tableSelRect.toRect();
        */
    } else if (cursor.hasSelection()) {
        const int position = cursor.selectionStart();
        const int anchor = cursor.selectionEnd();
        const QTextBlock posBlock = d->doc->findBlock(position);
        const QTextBlock anchorBlock = d->doc->findBlock(anchor);
        if (posBlock == anchorBlock && posBlock.isValid() && posBlock.layout()->lineCount()) {
            const QTextLine posLine = posBlock.layout()->lineForTextPosition(position - posBlock.position());
            const QTextLine anchorLine = anchorBlock.layout()->lineForTextPosition(anchor - anchorBlock.position());

            const int firstLine = qMin(posLine.lineNumber(), anchorLine.lineNumber());
            const int lastLine = qMax(posLine.lineNumber(), anchorLine.lineNumber());
            const QTextLayout *layout = posBlock.layout();
            r = QRectF();
            for (int i = firstLine; i <= lastLine; ++i) {
                r |= layout->lineAt(i).rect();
                r |= layout->lineAt(i).naturalTextRect(); // might be bigger in the case of wrap not enabled
            }
            r.translate(blockBoundingRect(posBlock).topLeft());
        } else {
            QRectF anchorRect = d->rectForPosition(cursor.selectionEnd());
            r |= anchorRect;
            r |= boundingRectOfFloatsInSelection(cursor);
            QRectF frameRect(d->doc->documentLayout()->frameBoundingRect(cursor.currentFrame()));
            r.setLeft(frameRect.left());
            r.setRight(frameRect.right());
        }
        if (r.isValid())
            r.adjust(-1, -1, 1, 1);
    }

    return r;
}